

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_block::dump(statement_block *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  statement_base **ptr;
  _Elt_pointer ppsVar2;
  _Elt_pointer ppsVar3;
  _Map_pointer pppsVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< BeginBlock >\n",0xf);
  ppsVar2 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar2 != ppsVar1) {
    ppsVar3 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar4 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar2)->_vptr_statement_base[5])(*ppsVar2,o);
      ppsVar2 = ppsVar2 + 1;
      if (ppsVar2 == ppsVar3) {
        ppsVar2 = pppsVar4[1];
        pppsVar4 = pppsVar4 + 1;
        ppsVar3 = ppsVar2 + 0x40;
      }
    } while (ppsVar2 != ppsVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< EndBlock >\n",0xd);
  return;
}

Assistant:

void statement_block::dump(std::ostream &o) const
	{
		o << "< BeginBlock >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndBlock >\n";
	}